

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void find_suite::upper_bound(void)

{
  initializer_list<int> input;
  initializer_list<int> __l;
  iterator iVar1;
  iterator iVar2;
  basic_iterator<int> first_begin;
  allocator_type local_8d;
  int local_8c;
  vector<int,_std::allocator<int>_> expect;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.cap = 4;
  span.member.size = 0;
  span.member.next = 4;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&expect;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  iVar2 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x21);
  first_begin = std::
                __upper_bound<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int,__gnu_cxx::__ops::_Val_less_iter>
                          (iVar1.parent,iVar1.current,iVar2.parent,iVar2.current,&expect);
  local_8c = 0x2c;
  __l._M_len = 1;
  __l._M_array = &local_8c;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_8d);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x17c,"void find_suite::upper_bound()",first_begin,iVar1,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void upper_bound()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    auto upper = std::upper_bound(span.begin(), span.end(), 33);
    {
        std::vector<int> expect = { 44 };
        BOOST_TEST_ALL_EQ(upper, span.end(),
                          expect.begin(), expect.end());
    }
}